

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

void cvui::internal::sparkline
               (cvui_block_t *theBlock,vector<double,_std::allocator<double>_> *theValues,int theX,
               int theY,int theWidth,int theHeight,uint theColor)

{
  int theY_00;
  int theX_00;
  vector<double,_std::allocator<double>_> *pvVar1;
  char *__s;
  Size_<int> local_94;
  Size_<int> local_8c;
  Size aSize;
  allocator<char> local_71;
  String local_70;
  size_type local_50;
  size_type aHowManyValues;
  Rect aRect;
  double aMax;
  double aMin;
  int theHeight_local;
  int theWidth_local;
  int theY_local;
  int theX_local;
  vector<double,_std::allocator<double>_> *theValues_local;
  cvui_block_t *theBlock_local;
  
  aMin._0_4_ = theHeight;
  aMin._4_4_ = theWidth;
  theHeight_local = theY;
  theWidth_local = theX;
  _theY_local = theValues;
  theValues_local = (vector<double,_std::allocator<double>_> *)theBlock;
  cv::Rect_<int>::Rect_((Rect_<int> *)&aHowManyValues,theX,theY,theWidth,theHeight);
  local_50 = std::vector<double,_std::allocator<double>_>::size(_theY_local);
  pvVar1 = theValues_local;
  theX_00 = theWidth_local;
  theY_00 = theHeight_local;
  if (local_50 < 2) {
    __s = "Insufficient data points.";
    if (local_50 == 0) {
      __s = "No data.";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_71);
    text((cvui_block_t *)pvVar1,theX_00,theY_00,&local_70,0.4,0xcecece,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  else {
    findMinMax(_theY_local,&aMax,(double *)&aRect.width);
    render::sparkline((cvui_block_t *)theValues_local,_theY_local,(Rect *)&aHowManyValues,aMax,
                      (double)aRect._8_8_,theColor);
  }
  cv::Size_<int>::Size_(&local_8c,aMin._4_4_,aMin._0_4_);
  pvVar1 = theValues_local;
  cv::Size_<int>::Size_(&local_94,&local_8c);
  updateLayoutFlow((cvui_block_t *)pvVar1,&local_94);
  return;
}

Assistant:

void sparkline(cvui_block_t& theBlock, std::vector<double>& theValues, int theX, int theY, int theWidth, int theHeight, unsigned int theColor) {
		double aMin, aMax;
		cv::Rect aRect(theX, theY, theWidth, theHeight);
		std::vector<double>::size_type aHowManyValues = theValues.size();

		if (aHowManyValues >= 2) {
			internal::findMinMax(theValues, &aMin, &aMax);
			render::sparkline(theBlock, theValues, aRect, aMin, aMax, theColor);
		} else {
			internal::text(theBlock, theX, theY, aHowManyValues == 0 ? "No data." : "Insufficient data points.", 0.4, 0xCECECE, false);
		}

		// Update the layout flow
		cv::Size aSize(theWidth, theHeight);
		updateLayoutFlow(theBlock, aSize);
	}